

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPC_BaseModel.cpp
# Opt level: O0

void __thiscall Opcode::OPCODECREATE::OPCODECREATE(OPCODECREATE *this)

{
  OPCODECREATE *this_local;
  
  (this->mSettings).mLimit = 1;
  (this->mSettings).mRules = 0x7fffffff;
  this->mIMesh = (MeshInterface *)0x0;
  (this->mSettings).mRules = 0x22;
  (this->mSettings).mLimit = 1;
  this->mNoLeaf = true;
  this->mQuantized = true;
  this->mKeepOriginal = false;
  this->mCanRemap = false;
  return;
}

Assistant:

OPCODECREATE::OPCODECREATE()
{
	mIMesh				= null;
	mSettings.mRules	= SPLIT_SPLATTER_POINTS | SPLIT_GEOM_CENTER;
	mSettings.mLimit	= 1;	// Mandatory for complete trees
	mNoLeaf				= true;
	mQuantized			= true;
#ifdef __MESHMERIZER_H__
	mCollisionHull		= false;
#endif // __MESHMERIZER_H__
	mKeepOriginal		= false;
	mCanRemap			= false;
}